

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O1

void __thiscall
sfc::Map::save_pal_map(Map *this,string *path,bool column_order,uint split_w,uint split_h)

{
  byte_vec_t local_220;
  long local_208;
  filebuf local_200 [240];
  ios_base local_110 [264];
  
  palette_map(&local_220,this,column_order,split_w,split_h);
  std::ofstream::ofstream(&local_208,(string *)path,_S_trunc|_S_out|_S_bin);
  std::ostream::write((char *)&local_208,
                      (long)local_220.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  local_208 = _VTT;
  *(undefined8 *)(local_200 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_200);
  std::ios_base::~ios_base(local_110);
  if (local_220.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_220.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_220.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_220.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Map::save_pal_map(const std::string& path, bool column_order, unsigned split_w, unsigned split_h) const {
  sfc::write_file(path, palette_map(column_order, split_w, split_h));
}